

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Module::HasExplicitCapability(Module *this,uint32_t cap)

{
  bool bVar1;
  uint32_t uVar2;
  Instruction *this_00;
  uint32_t tcap;
  Instruction *ci;
  iterator __end2;
  iterator __begin2;
  InstructionList *__range2;
  uint32_t cap_local;
  Module *this_local;
  
  InstructionList::begin((InstructionList *)&__end2);
  InstructionList::end((InstructionList *)&ci);
  while( true ) {
    bVar1 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&ci);
    if (!bVar1) {
      return false;
    }
    this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    uVar2 = opt::Instruction::GetSingleWordOperand(this_00,0);
    if (uVar2 == cap) break;
    InstructionList::iterator::operator++(&__end2);
  }
  return true;
}

Assistant:

bool Module::HasExplicitCapability(uint32_t cap) {
  for (auto& ci : capabilities_) {
    uint32_t tcap = ci.GetSingleWordOperand(0);
    if (tcap == cap) {
      return true;
    }
  }
  return false;
}